

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadPool.c
# Opt level: O3

void destroy_tpool(tpool_t *pool)

{
  pthread_mutex_t *__mutex;
  tpool_work_t *__ptr;
  ulong uVar1;
  
  if (pool->shutdown != 0) {
    return;
  }
  pool->shutdown = 1;
  __mutex = &pool->queue_lock;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  pthread_cond_broadcast((pthread_cond_t *)&pool->queue_ready);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (pool->maxnum_thread != 0) {
    uVar1 = 0;
    do {
      pthread_join(pool->thread_id[uVar1],(void **)0x0);
      uVar1 = uVar1 + 1;
    } while (uVar1 < pool->maxnum_thread);
  }
  __ptr = (tpool_work_t *)pool->thread_id;
  while( true ) {
    free(__ptr);
    __ptr = pool->tpool_head;
    if (__ptr == (tpool_work_t *)0x0) break;
    pool->tpool_head = (tpool_work_t *)__ptr->next;
  }
  pthread_mutex_destroy((pthread_mutex_t *)__mutex);
  pthread_cond_destroy((pthread_cond_t *)&pool->queue_ready);
  free(pool);
  return;
}

Assistant:

void destroy_tpool(tpool_t* pool)
{
   tpool_work_t* tmp_work;
 
   if(pool->shutdown){
        return;
   }
   pool->shutdown = 1;
 
   pthread_mutex_lock(&pool->queue_lock);
   pthread_cond_broadcast(&pool->queue_ready);
   pthread_mutex_unlock(&pool->queue_lock);
 
   for(int i = 0; i < pool->maxnum_thread; i++){
        pthread_join(pool->thread_id[i],NULL);
   }
   free(pool->thread_id);
   while(pool->tpool_head){
        tmp_work = pool->tpool_head;
        pool->tpool_head = (tpool_work_t*)pool->tpool_head->next;
        free(tmp_work);
   }
 
   pthread_mutex_destroy(&pool->queue_lock);
   pthread_cond_destroy(&pool->queue_ready);
   free(pool);
}